

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O2

void __thiscall w3Interp::Rotr_i32(w3Interp *this)

{
  byte bVar1;
  uint32_t uVar2;
  uint32_t *puVar3;
  
  uVar2 = w3Stack::pop_u32(&this->super_w3Stack);
  puVar3 = w3Stack::u32(&this->super_w3Stack);
  bVar1 = (byte)uVar2 & 0x1f;
  *puVar3 = *puVar3 >> bVar1 | *puVar3 << 0x20 - bVar1;
  return;
}

Assistant:

INTERP (Rotr_i32)
{
    const uint32_t n = 32;
    const uint32_t b = (uint32_t)(pop_u32 () & (n - 1));
    uint32_t& r = u32 ();
    uint32_t a = r;
#if _MSC_VER
    r = _rotr (a, (int)b);
#else
    r = (a >> b) | (a << (n - b));
#endif
}